

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_subx_rr_8(m68k_info *info)

{
  build_rr(info,0x15d,'\x01',0);
  return;
}

Assistant:

static void d68000_subx_rr_8(m68k_info *info)
{
	build_rr(info, M68K_INS_SUBX, 1, 0);
}